

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f8205::t_debugger::f_print_value
          (t_debugger *this,t_pvalue *a_value,size_t a_depth)

{
  t_object *ptVar1;
  size_t sVar2;
  t_type_id *ppvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  int __c;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar6;
  t_svalue *ptVar7;
  long lVar8;
  FILE *pFVar9;
  char *pcVar10;
  size_t sVar11;
  size_t i_1;
  ulong uVar12;
  size_t a_depth_00;
  t_type *ptVar13;
  t_iterator i;
  t_pvalue local_40;
  
  ptVar1 = (a_value->super_t_pointer).v_p;
  pFVar9 = (FILE *)this->v_out;
  switch(ptVar1) {
  case (t_object *)0x0:
    pcVar10 = "null";
    break;
  case (t_object *)0x1:
    pcVar10 = "false";
    break;
  case (t_object *)0x2:
    pcVar10 = "true";
    break;
  case (t_object *)0x3:
    paVar6 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar6 = &a_value->field_0;
    }
    fprintf(pFVar9,"%ld",paVar6->v_integer);
    return;
  case (t_object *)0x4:
    xemmai::t_type_of<double>::t_cast<double>::f_as<xemmai::t_value<xemmai::t_pointer>const&>
              (a_value);
    fprintf(pFVar9,"%g");
    return;
  default:
    fprintf(pFVar9,"@%p");
    a_depth_00 = a_depth - 1;
    if (a_depth_00 != 0) {
      fputc(0x28,(FILE *)this->v_out);
      ptVar13 = ((a_value->super_t_pointer).v_p)->v_type;
      sVar11 = ptVar13->v_instance_fields;
      if (sVar11 != 0) {
        ptVar13 = ptVar13 + 1;
        lVar8 = 8;
        while( true ) {
          sVar11 = sVar11 - 1;
          fprintf((FILE *)this->v_out,"%ls: ",
                  *(undefined8 *)(*(long *)((ptVar13->v_this).v_p._M_b._M_p)->v_data + 0x20));
          ptVar1 = (a_value->super_t_pointer).v_p;
          sVar2 = ptVar1->v_type->v_fields_offset;
          i.v_table = *(t_object **)(ptVar1->v_data + lVar8 + sVar2 + -0x50);
          i.v_entry = *(t_entry **)(ptVar1->v_data + lVar8 + sVar2 + -0x48);
          f_print_value(this,(t_pvalue *)&i,a_depth_00);
          if (sVar11 == 0) break;
          fputs(", ",(FILE *)this->v_out);
          lVar8 = lVar8 + 0x10;
          ptVar13 = (t_type *)&ptVar13->v_super;
        }
      }
      fputc(0x29,(FILE *)this->v_out);
    }
    ptVar1 = (a_value->super_t_pointer).v_p;
    sVar11 = ptVar1->v_type->v_depth;
    if (sVar11 != 0) {
      ppvVar3 = ptVar1->v_type->v_ids;
      puVar4 = (undefined8 *)ppvVar3[1];
      if (puVar4 == &xemmai::v__type_id<xemmai::t_string>) {
        fprintf((FILE *)this->v_out," \"%ls\"",ptVar1->v_data + 8);
      }
      else {
        if (puVar4 == &xemmai::v__type_id<xemmai::t_tuple>) {
          fputs(" \'(",(FILE *)this->v_out);
          if (a_depth_00 == 0) {
            fputs("...",(FILE *)this->v_out);
          }
          else {
            ptVar1 = (a_value->super_t_pointer).v_p;
            if (*(long *)ptVar1->v_data != 0) {
              i.v_table = *(t_object **)(ptVar1->v_data + 8);
              i.v_entry = *(t_entry **)(ptVar1->v_data + 0x10);
              f_print_value(this,(t_pvalue *)&i,a_depth_00);
              pcVar10 = ptVar1->v_data + 0x20;
              for (uVar12 = 1; uVar12 < *(ulong *)ptVar1->v_data; uVar12 = uVar12 + 1) {
                fputs(", ",(FILE *)this->v_out);
                i.v_table = *(t_object **)(pcVar10 + -8);
                i.v_entry = *(t_entry **)pcVar10;
                f_print_value(this,(t_pvalue *)&i,a_depth_00);
                pcVar10 = pcVar10 + 0x10;
              }
            }
          }
          pFVar9 = (FILE *)this->v_out;
          __c = 0x29;
        }
        else {
          if (sVar11 == 1) {
            return;
          }
          puVar4 = (undefined8 *)ppvVar3[2];
          if (puVar4 == &xemmai::v__type_id<xemmai::t_list>) {
            fputs(" [",(FILE *)this->v_out);
            if (a_depth_00 == 0) {
              fputs("...",(FILE *)this->v_out);
            }
            else {
              ptVar1 = (a_value->super_t_pointer).v_p;
              lVar8._0_1_ = ptVar1[1].v_color;
              lVar8._1_1_ = ptVar1[1].v_reviving;
              lVar8._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
              if (lVar8 != 0) {
                ptVar7 = xemmai::t_list::operator[]((t_list *)ptVar1->v_data,0);
                i.v_table = (ptVar7->super_t_slot).v_p._M_b._M_p;
                i.v_entry = *(t_entry **)&ptVar7->field_0;
                f_print_value(this,(t_pvalue *)&i,a_depth_00);
                for (uVar12 = 1; uVar5._0_1_ = ptVar1[1].v_color, uVar5._1_1_ = ptVar1[1].v_reviving
                    , uVar5._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a, uVar12 < uVar5;
                    uVar12 = uVar12 + 1) {
                  fputs(", ",(FILE *)this->v_out);
                  ptVar7 = xemmai::t_list::operator[]((t_list *)ptVar1->v_data,uVar12);
                  i.v_table = (ptVar7->super_t_slot).v_p._M_b._M_p;
                  i.v_entry = *(t_entry **)&ptVar7->field_0;
                  f_print_value(this,(t_pvalue *)&i,a_depth_00);
                }
              }
            }
            pFVar9 = (FILE *)this->v_out;
            __c = 0x5d;
          }
          else {
            if (puVar4 != &xemmai::v__type_id<xemmai::t_map>) {
              return;
            }
            fputs(" {",(FILE *)this->v_out);
            if (a_depth_00 == 0) {
              fputs("...",(FILE *)this->v_out);
            }
            else {
              xemmai::t_map::t_iterator::t_iterator(&i,(t_map *)ptVar1->v_data);
              if (i.v_entry != (t_entry *)0x0) {
                while( true ) {
                  local_40.super_t_pointer.v_p = ((i.v_entry)->v_key).super_t_slot.v_p._M_b._M_p;
                  local_40.field_0 =
                       *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
                        &((i.v_entry)->v_key).field_0;
                  f_print_value(this,&local_40,a_depth_00);
                  fputs(": ",(FILE *)this->v_out);
                  local_40.super_t_pointer.v_p = ((i.v_entry)->v_value).super_t_slot.v_p._M_b._M_p;
                  local_40.field_0 =
                       *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
                        &((i.v_entry)->v_value).field_0;
                  f_print_value(this,&local_40,a_depth_00);
                  xemmai::t_map::t_iterator::f_next(&i);
                  if (i.v_entry == (t_entry *)0x0) break;
                  fputs(", ",(FILE *)this->v_out);
                }
              }
            }
            pFVar9 = (FILE *)this->v_out;
            __c = 0x7d;
          }
        }
        fputc(__c,pFVar9);
      }
    }
    return;
  }
  fputs(pcVar10,pFVar9);
  return;
}

Assistant:

void f_print_value(const t_pvalue& a_value, size_t a_depth)
	{
		switch (a_value.f_tag()) {
		case c_tag__NULL:
			std::fputs("null", v_out);
			break;
		case c_tag__FALSE:
			std::fputs("false", v_out);
			break;
		case c_tag__TRUE:
			std::fputs("true", v_out);
			break;
		case c_tag__INTEGER:
			std::fprintf(v_out, "%" PRIdPTR, f_as<intptr_t>(a_value));
			break;
		case c_tag__FLOAT:
			std::fprintf(v_out, "%g", f_as<double>(a_value));
			break;
		default:
			std::fprintf(v_out, "@%p", static_cast<t_object*>(a_value));
			if (--a_depth > 0) {
				std::fputc('(', v_out);
				auto type = a_value->f_type();
				auto n = type->v_instance_fields;
				if (n > 0) {
					size_t i = 0;
					while (true) {
						std::fprintf(v_out, "%ls: ", type->f_fields()[i].first->f_as<t_symbol>().f_string().c_str());
						f_print_value(a_value->f_fields()[i], a_depth);
						if (++i >= n) break;
						std::fputs(", ", v_out);
					}
				}
				std::fputc(')', v_out);
			}
			if (f_is<t_string>(a_value)) {
				std::fprintf(v_out, " \"%ls\"", static_cast<const wchar_t*>(a_value->f_as<t_string>()));
			} else if (f_is<t_tuple>(a_value)) {
				std::fputs(" '(", v_out);
				f_print_sequence<t_tuple>(a_value, a_depth);
				std::fputc(')', v_out);
			} else if (f_is<t_list>(a_value)) {
				std::fputs(" [", v_out);
				f_print_sequence<t_list>(a_value, a_depth);
				std::fputc(']', v_out);
			} else if (f_is<t_map>(a_value)) {
				auto& map = a_value->f_as<t_map>();
				std::fputs(" {", v_out);
				if (a_depth <= 0) {
					std::fputs("...", v_out);
				} else {
					t_map::t_iterator i(map);
					if (i.f_entry()) {
						while (true) {
							f_print_value(i.f_entry()->f_key(), a_depth);
							std::fputs(": ", v_out);
							f_print_value(i.f_entry()->v_value, a_depth);
							i.f_next();
							if (!i.f_entry()) break;
							std::fputs(", ", v_out);
						}
					}
				}
				std::fputc('}', v_out);
			}
		}
	}